

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_int,int>(ostream *out,char *fmt,uint *args,int *args_1)

{
  long lVar1;
  ostream *in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<unsigned_int,int>(in_RDI,(int *)in_stack_ffffffffffffff78);
  vformat(in_RSI,(char *)in_RDI,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}